

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O1

size_t __thiscall luna::Function::AddInstruction(Function *this,Instruction i,int line)

{
  iterator __position;
  iterator __position_00;
  int local_10;
  Instruction local_c;
  
  __position._M_current =
       (this->opcodes_).super__Vector_base<luna::Instruction,_std::allocator<luna::Instruction>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_10 = line;
  local_c.opcode_ = i.opcode_;
  if (__position._M_current ==
      (this->opcodes_).super__Vector_base<luna::Instruction,_std::allocator<luna::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<luna::Instruction,std::allocator<luna::Instruction>>::
    _M_realloc_insert<luna::Instruction_const&>
              ((vector<luna::Instruction,std::allocator<luna::Instruction>> *)&this->opcodes_,
               __position,&local_c);
  }
  else {
    (__position._M_current)->opcode_ = i.opcode_;
    (this->opcodes_).super__Vector_base<luna::Instruction,_std::allocator<luna::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  __position_00._M_current =
       (this->opcode_lines_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->opcode_lines_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->opcode_lines_,__position_00,&local_10);
  }
  else {
    *__position_00._M_current = local_10;
    (this->opcode_lines_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  return ((long)(this->opcodes_).
                super__Vector_base<luna::Instruction,_std::allocator<luna::Instruction>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->opcodes_).
                super__Vector_base<luna::Instruction,_std::allocator<luna::Instruction>_>._M_impl.
                super__Vector_impl_data._M_start >> 2) - 1;
}

Assistant:

std::size_t Function::AddInstruction(Instruction i, int line)
    {
        opcodes_.push_back(i);
        opcode_lines_.push_back(line);
        return opcodes_.size() - 1;
    }